

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_storage.c
# Opt level: O0

void * l2_storage_mem_new_with_zero(l2_storage *storage_p,l2_mem_size mem_size)

{
  _l2_mem_link *p_Var1;
  void *pvVar2;
  l2_mem_link *plVar3;
  l2_mem_link *local_28;
  l2_mem_link *mem_link;
  l2_mem_size mem_size_local;
  l2_storage *storage_p_local;
  
  if (storage_p->head_p == (l2_mem_link *)0x0) {
    plVar3 = (l2_mem_link *)malloc(0x10);
    storage_p->head_p = plVar3;
    storage_p->head_p->next = (_l2_mem_link *)0x0;
    pvVar2 = calloc(mem_size,1);
    storage_p->head_p->mem_p = pvVar2;
    l2_assert_func((long)pvVar2,L2_INTERNAL_ERROR_NULL_POINTER,"l2_storage_mem_new_with_zero",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_mem/l2_storage.c"
                   ,0x3c);
    storage_p->size = storage_p->size + 1;
    storage_p_local = (l2_storage *)storage_p->head_p->mem_p;
  }
  else {
    for (local_28 = storage_p->head_p; local_28->next != (_l2_mem_link *)0x0;
        local_28 = local_28->next) {
    }
    p_Var1 = (_l2_mem_link *)malloc(0x10);
    local_28->next = p_Var1;
    local_28->next->next = (_l2_mem_link *)0x0;
    pvVar2 = calloc(mem_size,1);
    local_28->next->mem_p = pvVar2;
    l2_assert_func((long)pvVar2,L2_INTERNAL_ERROR_NULL_POINTER,"l2_storage_mem_new_with_zero",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_mem/l2_storage.c"
                   ,0x35);
    storage_p->size = storage_p->size + 1;
    storage_p_local = (l2_storage *)local_28->next->mem_p;
  }
  return storage_p_local;
}

Assistant:

void *l2_storage_mem_new_with_zero(l2_storage *storage_p, l2_mem_size mem_size) {
    if (storage_p->head_p) {
        l2_mem_link *mem_link;
        for (mem_link = storage_p->head_p; mem_link->next != L2_NULL_PTR; mem_link = mem_link->next);
        mem_link->next = malloc(sizeof(l2_mem_link));
        mem_link->next->next = L2_NULL_PTR;
        l2_assert(mem_link->next->mem_p = calloc(mem_size, 1), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return mem_link->next->mem_p;

    } else {
        storage_p->head_p = malloc(sizeof(l2_mem_link));
        storage_p->head_p->next = L2_NULL_PTR;
        l2_assert(storage_p->head_p->mem_p = calloc(mem_size, 1), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return storage_p->head_p->mem_p;
    }
}